

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_nullwindow.c
# Opt level: O0

short SEARCH_nullwindow(chess_state_t *state,search_state_t *search_state,uchar depth,uchar ply,
                       move_t *move,short beta)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  uint uVar6;
  int local_51c;
  short score_1;
  undefined8 uStack_518;
  int i;
  int margin [4];
  uint local_500;
  int do_futility_pruning;
  int num_moves;
  move_t moves [256];
  undefined1 local_f0 [2];
  short score;
  move_t next_move;
  chess_state_t next_state;
  int iStack_58;
  uchar R_plus_1;
  short best_score;
  short ttable_score;
  int cutoff;
  int num_checkers;
  bitboard_t pinned;
  bitboard_t pinners;
  bitboard_t block_check;
  move_t *pmStack_30;
  short beta_local;
  move_t *move_local;
  uchar ply_local;
  search_state_t *psStack_20;
  uchar depth_local;
  search_state_t *search_state_local;
  chess_state_t *state_local;
  
  *move = 0;
  search_state->pv_table[ply].size = 0;
  search_state->next_clock_check = search_state->next_clock_check + -1;
  block_check._6_2_ = beta;
  pmStack_30 = move;
  move_local._6_1_ = ply;
  move_local._7_1_ = depth;
  psStack_20 = search_state;
  search_state_local = (search_state_t *)state;
  if (search_state->next_clock_check < 1) {
    search_state->next_clock_check = 10000;
    iVar5 = CLOCK_time_passed(search_state->start_time_ms);
    if (psStack_20->time_for_move_ms <= iVar5) {
      psStack_20->abort_search = 1;
    }
  }
  if (psStack_20->abort_search == 0) {
    if (100 < move_local._6_1_) {
      move_local._6_1_ = 100;
    }
    HASHTABLE_transition_prefetch
              (psStack_20->hashtable,(bitboard_t)search_state_local->killer_move[8]);
    _best_score = STATE_checkers_and_pinners
                            ((chess_state_t *)search_state_local,&pinners,&pinned,
                             (bitboard_t *)&cutoff);
    if (_best_score != 0) {
      move_local._7_1_ = move_local._7_1_ + 1;
    }
    if (move_local._7_1_ == 0) {
      state_local._6_2_ =
           SEARCH_nullwindow_quiescence
                     ((chess_state_t *)search_state_local,psStack_20,block_check._6_2_);
    }
    else {
      iStack_58 = 0;
      next_state._142_2_ =
           SEARCH_transpositiontable_retrieve
                     (psStack_20->hashtable,(bitboard_t)search_state_local->killer_move[8],
                      move_local._7_1_,block_check._6_2_,pmStack_30,&stack0xffffffffffffffa8);
      if ((iStack_58 == 0) ||
         ((state_local._6_2_ = next_state._142_2_, *pmStack_30 == 0 &&
          (search_state_local->killer_move[9][0] == 0)))) {
        next_state._140_2_ = -1000 - (ushort)move_local._7_1_;
        if ((4 < move_local._7_1_) &&
           (((search_state_local->killer_move[9][0] != 0 && (_best_score == 0)) &&
            (iVar3 = STATE_risk_zugzwang((chess_state_t *)search_state_local), iVar3 == 0)))) {
          next_state._139_1_ = 3;
          if (5 < move_local._7_1_) {
            next_state._139_1_ = 4;
          }
          memcpy(local_f0,search_state_local,0x90);
          STATE_apply_move((chess_state_t *)local_f0,0);
          sVar2 = SEARCH_nullwindow((chess_state_t *)local_f0,psStack_20,
                                    move_local._7_1_ - next_state._139_1_,move_local._6_1_ + 1,
                                    moves + 0xff,1 - block_check._6_2_);
          moves[0xfe]._2_2_ = -sVar2;
          if (block_check._6_2_ <= moves[0xfe]._2_2_) {
            next_state._140_2_ = block_check._6_2_;
          }
        }
        if ((short)next_state._140_2_ < block_check._6_2_) {
          iVar3 = STATE_generate_moves
                            ((chess_state_t *)search_state_local,_best_score,pinners,pinned,_cutoff,
                             (move_t *)&do_futility_pruning);
          MOVEORDER_rate_moves
                    ((chess_state_t *)search_state_local,(move_t *)&do_futility_pruning,iVar3,
                     *pmStack_30,psStack_20->killer_move[move_local._6_1_],
                     psStack_20->history_heuristic
                     [*(byte *)((long)search_state_local->killer_move[9] + 7)]);
          local_500 = 0;
          if ((move_local._7_1_ < 4) && (_best_score == 0)) {
            uStack_518 = 0x1400000000;
            margin[0] = 0x19;
            margin[1] = 0x1e;
            iVar4 = (int)block_check._6_2_;
            sVar2 = EVAL_evaluate_board((chess_state_t *)search_state_local);
            local_500 = (uint)((int)sVar2 +
                               *(int *)((long)&stack0xfffffffffffffae8 + (ulong)move_local._7_1_ * 4
                                       ) < iVar4);
          }
          for (local_51c = 0; local_51c < iVar3; local_51c = local_51c + 1) {
            MOVEORDER_best_move_first
                      ((move_t *)(&do_futility_pruning + local_51c),iVar3 - local_51c);
            sVar2 = SEARCH_move((chess_state_t *)search_state_local,psStack_20,move_local._7_1_,
                                move_local._6_1_,(&do_futility_pruning)[local_51c],local_51c,
                                local_500,_best_score,next_state._140_2_,block_check._6_2_);
            if ((short)next_state._140_2_ < sVar2) {
              next_state._140_2_ = sVar2;
              *pmStack_30 = (&do_futility_pruning)[local_51c];
              psStack_20->pv_table[move_local._6_1_].moves[0] = *pmStack_30;
              memcpy(psStack_20->pv_table[move_local._6_1_].moves + 1,
                     psStack_20->pv_table + (int)(move_local._6_1_ + 1),
                     (long)psStack_20->pv_table[(int)(move_local._6_1_ + 1)].size << 2);
              psStack_20->pv_table[move_local._6_1_].size =
                   psStack_20->pv_table[(int)(move_local._6_1_ + 1)].size + 1;
              if (block_check._6_2_ <= (short)next_state._140_2_) {
                if ((*pmStack_30 & 0x300000) == 0) {
                  if (*pmStack_30 != psStack_20->killer_move[move_local._6_1_][0]) {
                    psStack_20->killer_move[move_local._6_1_][1] =
                         psStack_20->killer_move[move_local._6_1_][0];
                    psStack_20->killer_move[move_local._6_1_][0] = *pmStack_30;
                  }
                  bVar1 = *(byte *)((long)search_state_local->killer_move[9] + 7);
                  uVar6 = (*pmStack_30 & 0xfc0) >> 6;
                  psStack_20->history_heuristic[bVar1][*pmStack_30 & 0x3f][uVar6] =
                       (uint)move_local._7_1_ * (uint)move_local._7_1_ +
                       psStack_20->history_heuristic[bVar1][*pmStack_30 & 0x3f][uVar6];
                }
                break;
              }
            }
          }
          if ((iVar3 == 0) && (_best_score == 0)) {
            next_state._140_2_ = 0;
          }
        }
        if (psStack_20->abort_search == 0) {
          SEARCH_transpositiontable_store
                    (psStack_20->hashtable,(bitboard_t)search_state_local->killer_move[8],
                     move_local._7_1_,next_state._140_2_,*pmStack_30,block_check._6_2_);
        }
        state_local._6_2_ = next_state._140_2_;
      }
    }
  }
  else {
    state_local._6_2_ = 0;
  }
  return state_local._6_2_;
}

Assistant:

short SEARCH_nullwindow(const chess_state_t *state, search_state_t *search_state, unsigned char depth, unsigned char ply, move_t *move, short beta)
{
    *move = 0;
    search_state->pv_table[ply].size = 0;

    /* Check if time is up */
    search_state->next_clock_check--;
    if(search_state->next_clock_check <= 0) {
        search_state->next_clock_check = SEARCH_ITERATIONS_BETWEEN_CLOCK_CHECK;
        if(CLOCK_time_passed(search_state->start_time_ms) >= search_state->time_for_move_ms) {
            search_state->abort_search = 1;
        }
    }
    if(search_state->abort_search) {
        return 0;
    }

    if(ply > MAX_SEARCH_DEPTH) ply = MAX_SEARCH_DEPTH;

    /* We will query the transition table soon, time to prefetch */
    HASHTABLE_transition_prefetch(search_state->hashtable, state->hash);

    /* Is playing side in check? */
    bitboard_t block_check, pinners, pinned;
    int num_checkers = STATE_checkers_and_pinners(state, &block_check, &pinners, &pinned);

    /* Check extension */
    if(num_checkers) {
        depth += 1;
    }

    /* Quiescence search */
    if(depth == 0) {
        return SEARCH_nullwindow_quiescence(state, search_state, beta);
    }

    /* Query the transposition table */
    int cutoff = 0;
    short ttable_score = SEARCH_transpositiontable_retrieve(search_state->hashtable, state->hash, depth, beta, move, &cutoff);
    if(cutoff) {
        if(*move || state->last_move) {
            return ttable_score;
        }
    }

    short best_score = SEARCH_MIN_RESULT(depth);

    /* Null move pruning */
    if(depth > 4 && state->last_move && !num_checkers && !STATE_risk_zugzwang(state)) {
        unsigned char R_plus_1 = ((depth > 5) ? 4 : 3);
        chess_state_t next_state = *state;
        STATE_apply_move(&next_state, 0);
        move_t next_move;
        short score = -SEARCH_nullwindow(&next_state, search_state, depth-R_plus_1, ply+1, &next_move, -beta+1);
        if(score >= beta) {
            best_score = beta;
        }
    }

    if(best_score < beta) {
        /* Generate and rate moves */
        move_t moves[256];
        int num_moves = STATE_generate_moves(state, num_checkers, block_check, pinners, pinned, moves);
        MOVEORDER_rate_moves(state, moves, num_moves, *move, search_state->killer_move[ply], search_state->history_heuristic[state->player]);

        /* Check if node is eligible for futility pruning */
        int do_futility_pruning = 0;
        if(depth <= 3 && !num_checkers) {
            const int margin[4] = { 0, 20, 25, 30 };
            if(beta > EVAL_evaluate_board(state) + margin[depth]) {
                do_futility_pruning = 1;
            }
        }

        /* Iterate over all moves */
        for(int i = 0; i < num_moves; i++) {
            /* Pick move with the highest score */
            MOVEORDER_best_move_first(&moves[i], num_moves - i);

            short score = SEARCH_move(state, search_state, depth, ply, moves[i], i, do_futility_pruning, num_checkers, best_score, beta);

            /* Check if score improved by this move */
            if(score > best_score) {
                best_score = score;
                *move = moves[i];

                search_state->pv_table[ply].moves[0] = *move;
                memcpy(&search_state->pv_table[ply].moves[1], search_state->pv_table[ply+1].moves, search_state->pv_table[ply+1].size * sizeof(move_t));
                search_state->pv_table[ply].size = 1 + search_state->pv_table[ply+1].size;

                /* Beta-cuttoff */
                if(best_score >= beta) {
                    if(!MOVE_IS_CAPTURE_OR_PROMOTION(*move)) {
                        /* Killer move */
                        if(*move != search_state->killer_move[ply][0]) {
                            search_state->killer_move[ply][1] = search_state->killer_move[ply][0];
                            search_state->killer_move[ply][0] = *move;
                        }
                        /* History heuristic */
                        search_state->history_heuristic[state->player][MOVE_GET_POS_FROM(*move)][MOVE_GET_POS_TO(*move)] += depth*depth;
                    }
                    break;
                }
            }
        }

        /* Detect checkmate and stalemate */
        if(num_moves == 0) {
            if(num_checkers) {
                /* Checkmate (worst case) */
            } else {
                /* Stalemate */
                best_score = 0;
            }
        }
    }

    /* Store the result in the transposition table */
    if(!search_state->abort_search) {
        SEARCH_transpositiontable_store(search_state->hashtable, state->hash, depth, best_score, *move, beta);
    }

    /* Return score */
    return best_score;
}